

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O1

yy_state_type __thiscall
deci_FlexLexer::yy_try_NUL_trans(deci_FlexLexer *this,yy_state_type yy_current_state)

{
  short *psVar1;
  long lVar2;
  short sVar3;
  long lVar4;
  
  lVar2 = (long)yy_current_state;
  if (yy_accept[lVar2] != 0) {
    this->yy_last_accepting_state = yy_current_state;
    this->yy_last_accepting_cpos = this->yy_c_buf_p;
  }
  lVar4 = (long)yy_base[lVar2];
  if (yy_chk[lVar4 + 1] != yy_current_state) {
    do {
      psVar1 = yy_def + lVar2;
      lVar2 = (long)*psVar1;
      lVar4 = (long)yy_base[lVar2];
    } while (*psVar1 != yy_chk[lVar4 + 1]);
  }
  sVar3 = 0;
  if (yy_nxt[lVar4 + 1] != 0x7a) {
    sVar3 = yy_nxt[lVar4 + 1];
  }
  return (int)sVar3;
}

Assistant:

yy_state_type yyFlexLexer::yy_try_NUL_trans( yy_state_type yy_current_state )
{
	int yy_is_jam;
    	char *yy_cp = (yy_c_buf_p);

	YY_CHAR yy_c = 1;
	if ( yy_accept[yy_current_state] )
		{
		(yy_last_accepting_state) = yy_current_state;
		(yy_last_accepting_cpos) = yy_cp;
		}
	while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
		{
		yy_current_state = (int) yy_def[yy_current_state];
		if ( yy_current_state >= 123 )
			yy_c = yy_meta[yy_c];
		}
	yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
	yy_is_jam = (yy_current_state == 122);

		return yy_is_jam ? 0 : yy_current_state;
}